

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O3

void loop_creating_worker(void *context)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 extraout_RAX;
  uint uVar2;
  uv_loop_t *puVar3;
  undefined8 in_R9;
  uv_signal_t signal;
  uv_signal_t uStack_5e0;
  uv_signal_t uStack_548;
  uv_signal_t uStack_4b0;
  uv_loop_t uStack_418;
  undefined1 *puStack_c8;
  
  while( true ) {
    puVar3 = (uv_loop_t *)0x350;
    loop = (uv_loop_t *)malloc(0x350);
    if (loop == (uv_loop_t *)0x0) break;
    puVar3 = loop;
    iVar1 = uv_loop_init(loop);
    if (iVar1 != 0) goto LAB_0016867a;
    puVar3 = loop;
    iVar1 = uv_signal_init(loop,(uv_signal_t *)&stack0xffffffffffffff48);
    if (iVar1 != 0) goto LAB_00168675;
    puVar3 = (uv_loop_t *)&stack0xffffffffffffff48;
    iVar1 = uv_signal_start((uv_signal_t *)&stack0xffffffffffffff48,signal_unexpected_cb,0xf);
    if (iVar1 != 0) goto LAB_00168670;
    uv_close((uv_handle_t *)&stack0xffffffffffffff48,(uv_close_cb)0x0);
    puVar3 = loop;
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0016866b;
    uv_loop_close(loop);
    free(loop);
    uv_mutex_lock(&counter_lock);
    loop_creation_counter = loop_creation_counter + 1;
    uv_mutex_unlock(&counter_lock);
    if (stop != 0) {
      return;
    }
  }
  loop_creating_worker_cold_5();
LAB_0016866b:
  loop_creating_worker_cold_4();
LAB_00168670:
  loop_creating_worker_cold_3();
LAB_00168675:
  loop_creating_worker_cold_2();
LAB_0016867a:
  loop_creating_worker_cold_1();
  puStack_c8 = &stack0xffffffffffffff48;
  iVar1 = uv_loop_init(&uStack_418);
  if (iVar1 == 0) {
    if (((ulong)puVar3 & 0xfffffffd) == 0) {
      iVar1 = uv_signal_init(&uStack_418,&uStack_4b0);
      if (iVar1 != 0) goto LAB_0016888f;
      iVar1 = uv_signal_start(&uStack_4b0,signal1_cb,10);
      if (iVar1 != 0) goto LAB_00168894;
      iVar1 = uv_signal_init(&uStack_418,&uStack_548);
      if (iVar1 != 0) goto LAB_00168899;
      iVar1 = uv_signal_start(&uStack_548,signal1_cb,10);
      if (iVar1 == 0) goto LAB_00168724;
      goto LAB_0016889e;
    }
LAB_00168724:
    uVar2 = (int)puVar3 - 1;
    if (uVar2 < 2) {
      iVar1 = uv_signal_init(&uStack_418,&uStack_5e0);
      if (iVar1 != 0) goto LAB_00168880;
      iVar1 = uv_signal_start(&uStack_5e0,signal2_cb,0xc);
      if (iVar1 == 0) goto LAB_00168760;
      goto LAB_00168885;
    }
LAB_00168760:
    uv_sem_post(&sem);
    iVar1 = uv_run(&uStack_418,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00168871;
    if (((ulong)puVar3 & 0xfffffffd) != 0) {
LAB_001687cd:
      if (1 < uVar2) {
LAB_001687ee:
        uv_sem_post(&sem);
        iVar1 = uv_run(&uStack_418,UV_RUN_DEFAULT);
        if (iVar1 != 0) goto LAB_00168876;
        if (((ulong)puVar3 & 0xfffffffd) == 0) {
          uv_close((uv_handle_t *)&uStack_4b0,(uv_close_cb)0x0);
          uv_close((uv_handle_t *)&uStack_548,(uv_close_cb)0x0);
        }
        if (uVar2 < 2) {
          uv_close((uv_handle_t *)&uStack_5e0,(uv_close_cb)0x0);
        }
        iVar1 = uv_run(&uStack_418,UV_RUN_DEFAULT);
        if (iVar1 == 0) {
          uv_loop_close(&uStack_418);
          return;
        }
        goto LAB_0016887b;
      }
      iVar1 = uv_signal_start(&uStack_5e0,signal2_cb,0xc);
      if (iVar1 == 0) goto LAB_001687ee;
      goto LAB_0016888a;
    }
    iVar1 = uv_signal_start(&uStack_4b0,signal1_cb,10);
    if (iVar1 == 0) {
      iVar1 = uv_signal_start(&uStack_548,signal1_cb,10);
      if (iVar1 != 0) goto LAB_001688a8;
      goto LAB_001687cd;
    }
  }
  else {
    signal_handling_worker_cold_1();
LAB_00168871:
    signal_handling_worker_cold_8();
LAB_00168876:
    signal_handling_worker_cold_12();
LAB_0016887b:
    signal_handling_worker_cold_13();
LAB_00168880:
    signal_handling_worker_cold_6();
LAB_00168885:
    signal_handling_worker_cold_7();
LAB_0016888a:
    signal_handling_worker_cold_11();
LAB_0016888f:
    signal_handling_worker_cold_2();
LAB_00168894:
    signal_handling_worker_cold_3();
LAB_00168899:
    signal_handling_worker_cold_4();
LAB_0016889e:
    signal_handling_worker_cold_5();
  }
  signal_handling_worker_cold_9();
LAB_001688a8:
  signal_handling_worker_cold_10();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
          ,0xa0,"0 && \"signal_unexpected_cb should never be called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

static void loop_creating_worker(void* context) {
  (void) context;

  do {
    uv_loop_t *loop;
    uv_signal_t signal;
    int r;

    loop = malloc(sizeof(*loop));
    ASSERT(loop != NULL);
    ASSERT(0 == uv_loop_init(loop));

    r = uv_signal_init(loop, &signal);
    ASSERT(r == 0);

    r = uv_signal_start(&signal, signal_unexpected_cb, SIGTERM);
    ASSERT(r == 0);

    uv_close((uv_handle_t*) &signal, NULL);

    r = uv_run(loop, UV_RUN_DEFAULT);
    ASSERT(r == 0);

    uv_loop_close(loop);
    free(loop);

    increment_counter(&loop_creation_counter);
  } while (!stop);
}